

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkMateGeneric::Initialize
          (ChLinkMateGeneric *this,shared_ptr<chrono::ChBodyFrame> *mbody1,
          shared_ptr<chrono::ChBodyFrame> *mbody2,bool pos_are_relative,ChVector<double> *mpt1,
          ChVector<double> *mpt2,ChVector<double> *mnorm1,ChVector<double> *mnorm2)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  element_type *peVar5;
  element_type *peVar6;
  ChBodyFrame *pCVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  int iVar19;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  double dVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  double dVar68;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  double dVar69;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  double dVar70;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  ChMatrix33<double> mrot;
  double local_1a8;
  double dStack_1a0;
  double local_198;
  ChMatrix33<double> local_188;
  ChFrame<double> local_140;
  ChFrame<double> local_b8;
  
  peVar5 = (mbody1->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  peVar6 = (mbody2->super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar5 == peVar6) {
    __assert_fail("mbody1.get() != mbody2.get()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChLinkMate.cpp"
                  ,0x108,
                  "virtual void chrono::ChLinkMateGeneric::Initialize(std::shared_ptr<ChBodyFrame>, std::shared_ptr<ChBodyFrame>, bool, ChVector<>, ChVector<>, ChVector<>, ChVector<>)"
                 );
  }
  (this->super_ChLinkMate).super_ChLink.Body1 = peVar5;
  (this->super_ChLinkMate).super_ChLink.Body2 = peVar6;
  iVar18 = (*(peVar5->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  iVar19 = (*(((this->super_ChLinkMate).super_ChLink.Body2)->super_ChFrameMoving<double>).
             super_ChFrame<double>._vptr_ChFrame[0x10])();
  ChLinkMask::SetTwoBodiesVariables
            (&this->mask,(ChVariables *)CONCAT44(extraout_var,iVar18),
             (ChVariables *)CONCAT44(extraout_var_00,iVar19));
  local_140._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_140.coord.pos.m_data[0] = 0.0;
  local_140.coord.pos.m_data[1] = 0.0;
  local_140.coord.pos.m_data[2] = 0.0;
  local_b8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  local_b8.coord.pos.m_data[0] = 0.0;
  local_b8.coord.pos.m_data[1] = 0.0;
  local_b8.coord.pos.m_data[2] = 0.0;
  local_b8.coord.rot.m_data[0] = 1.0;
  local_b8.coord.rot.m_data[1] = 0.0;
  local_b8.coord.rot.m_data[2] = 0.0;
  local_b8.coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_b8.Amatrix,(ChQuaternion<double> *)&local_140);
  local_140._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  local_140.coord.pos.m_data[2] = 0.0;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  local_140.coord.pos.m_data[0] = 0.0;
  local_140.coord.pos.m_data[1] = 0.0;
  local_140.coord.rot.m_data[0] = 1.0;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  local_140.coord.rot.m_data[1] = 0.0;
  local_140.coord.rot.m_data[2] = 0.0;
  local_140.coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_140.Amatrix,(ChQuaternion<double> *)&local_188);
  dVar2 = DAT_00b689f0;
  dVar1 = DAT_00b689e8;
  dVar68 = VECT_Z;
  if (!pos_are_relative) {
    pCVar7 = (this->super_ChLinkMate).super_ChLink.Body1;
    auVar26 = ZEXT816(0);
    dVar69 = mnorm1->m_data[1];
    auVar36._8_8_ = mnorm1->m_data[0];
    auVar36._0_8_ = mnorm1->m_data[0];
    auVar71._8_8_ = mnorm1->m_data[2];
    auVar71._0_8_ = mnorm1->m_data[2];
    auVar104._8_8_ = 0;
    auVar104._0_8_ = VECT_Z;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = DAT_00b689e8;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = DAT_00b689f0;
    auVar57._0_8_ =
         dVar69 * (pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4];
    auVar57._8_8_ =
         dVar69 * (pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[5];
    auVar28._8_8_ = 0;
    auVar28._0_8_ =
         (pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar46._8_8_ = 0;
    auVar46._0_8_ =
         dVar69 * (pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[3];
    auVar46 = vfmadd231sd_fma(auVar46,auVar36,auVar28);
    auVar28 = vfmadd231pd_fma(auVar57,auVar36,
                              *(undefined1 (*) [16])
                               ((pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                                super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 1));
    auVar81._8_8_ = 0;
    auVar81._0_8_ =
         (pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar81 = vfmadd231sd_fma(auVar46,auVar71,auVar81);
    auVar28 = vfmadd231pd_fma(auVar28,auVar71,
                              *(undefined1 (*) [16])
                               ((pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                                super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 7));
    dVar69 = auVar81._0_8_;
    if ((dVar69 != 0.0) || (NAN(dVar69))) {
LAB_005a4ec9:
      dVar44 = auVar28._0_8_;
      auVar28 = vshufpd_avx(auVar28,auVar28,1);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = dVar44 * dVar44;
      auVar81 = vfmadd231sd_fma(auVar33,auVar81,auVar81);
      auVar81 = vfmadd231sd_fma(auVar81,auVar28,auVar28);
      auVar81 = vsqrtsd_avx(auVar81,auVar81);
      bVar15 = 2.2250738585072014e-308 <= auVar81._0_8_;
      dVar70 = 1.0 / auVar81._0_8_;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = (ulong)bVar15 * (long)(auVar28._0_8_ * dVar70);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = (ulong)bVar15 * (long)(dVar44 * dVar70);
      auVar27._0_8_ = (ulong)bVar15 * (long)(dVar69 * dVar70) + (ulong)!bVar15 * 0x3ff0000000000000;
      auVar27._8_8_ = 0;
    }
    else {
      uVar8 = vcmppd_avx512vl(auVar28,_DAT_00952100,0);
      if (((uVar8 & 1) == 0) || ((uVar8 & 3) >> 1 == 0)) goto LAB_005a4ec9;
      auVar27 = ZEXT816(0x3ff0000000000000);
      auVar25 = ZEXT816(0);
    }
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         auVar27._0_8_;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         auVar25._0_8_;
    auVar76._8_8_ = 0;
    auVar76._0_8_ =
         DAT_00b689f0 *
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar28 = vfmsub231sd_fma(auVar76,auVar25,auVar104);
    auVar61._8_8_ = 0;
    auVar61._0_8_ =
         DAT_00b689e8 *
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    auVar81 = vfmsub231sd_fma(auVar61,auVar26,auVar102);
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         auVar81._0_8_;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         auVar28._0_8_;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         auVar26._0_8_;
    auVar89._8_8_ = 0;
    auVar89._0_8_ =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar28 = vfmadd231sd_fma(auVar89,auVar81,auVar81);
    auVar50._8_8_ = 0;
    auVar50._0_8_ =
         VECT_Z * local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[3];
    auVar81 = vfmsub231sd_fma(auVar50,auVar27,auVar103);
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         auVar81._0_8_;
    auVar28 = vfmadd231sd_fma(auVar28,auVar81,auVar81);
    auVar28 = vsqrtsd_avx(auVar28,auVar28);
    dVar69 = auVar28._0_8_;
    if (dVar69 < 0.0001) {
      auVar9._8_8_ = 0x7fffffffffffffff;
      auVar9._0_8_ = 0x7fffffffffffffff;
      auVar28 = vandpd_avx512vl(auVar104,auVar9);
      if (0.9 <= auVar28._0_8_) {
        auVar13._8_8_ = 0x7fffffffffffffff;
        auVar13._0_8_ = 0x7fffffffffffffff;
        auVar28 = vandpd_avx512vl(auVar103,auVar13);
        if (0.9 <= auVar28._0_8_) {
          auVar14._8_8_ = 0x7fffffffffffffff;
          auVar14._0_8_ = 0x7fffffffffffffff;
          auVar28 = vandpd_avx512vl(auVar102,auVar14);
          auVar81 = SUB6416(ZEXT864(0),0) << 0x40;
          if (0.9 <= auVar28._0_8_) goto LAB_005a4fdf;
          auVar28 = ZEXT816(0x3ff0000000000000);
        }
        else {
          auVar81 = ZEXT816(0x3ff0000000000000);
LAB_005a4fdf:
          auVar28 = ZEXT816(0);
        }
        auVar46 = ZEXT816(0) << 0x40;
      }
      else {
        auVar46 = ZEXT816(0x3ff0000000000000);
        auVar28 = ZEXT816(0);
        auVar81 = ZEXT816(0) << 0x40;
      }
      auVar77._8_8_ = 0;
      auVar77._0_8_ =
           auVar28._0_8_ *
           -local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      auVar36 = vfmadd231sd_fma(auVar77,auVar25,auVar46);
      auVar62._8_8_ = 0;
      auVar62._0_8_ =
           auVar81._0_8_ *
           -local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
      auVar28 = vfmadd231sd_fma(auVar62,auVar26,auVar28);
      local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           auVar28._0_8_;
      auVar51._8_8_ = 0;
      auVar51._0_8_ =
           auVar46._0_8_ *
           -local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      auVar81 = vfmadd231sd_fma(auVar51,auVar27,auVar81);
      local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           auVar81._0_8_;
      local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
           auVar36._0_8_;
      auVar90._8_8_ = 0;
      auVar90._0_8_ =
           local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
           local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      auVar28 = vfmadd231sd_fma(auVar90,auVar28,auVar28);
      auVar28 = vfmadd231sd_fma(auVar28,auVar81,auVar81);
      auVar28 = vsqrtsd_avx(auVar28,auVar28);
      dVar69 = auVar28._0_8_;
    }
    dVar69 = 1.0 / dVar69;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] *
         dVar69;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
         dVar69;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
         dVar69;
    auVar78._8_8_ = 0;
    auVar78._0_8_ =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar91._8_8_ = 0;
    auVar91._0_8_ =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar28 = vfmsub231sd_fma(auVar91,auVar78,auVar25);
    auVar52._8_8_ = 0;
    auVar52._0_8_ =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar97._8_8_ = 0;
    auVar97._0_8_ =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] *
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar81 = vfmsub231sd_fma(auVar97,auVar52,auVar27);
    auVar63._8_8_ = 0;
    auVar63._0_8_ =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar101._8_8_ = 0;
    auVar101._0_8_ =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] *
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar46 = vfmsub231sd_fma(auVar101,auVar63,auVar26);
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         auVar28._0_8_;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         auVar81._0_8_;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         auVar46._0_8_;
    ChFrame<double>::SetRot(&local_b8,&local_188);
    pCVar7 = (this->super_ChLinkMate).super_ChLink.Body1;
    ChTransform<double>::TransformParentToLocal
              (mpt1,&(pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos,
               &(pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
    auVar30 = ZEXT816(0x3ff0000000000000);
    local_b8.coord.pos.m_data[0] = local_1a8;
    local_b8.coord.pos.m_data[1] = dStack_1a0;
    local_b8.coord.pos.m_data[2] = local_198;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
    pCVar7 = (this->super_ChLinkMate).super_ChLink.Body2;
    dVar69 = mnorm2->m_data[1];
    auVar64._8_8_ = mnorm2->m_data[0];
    auVar64._0_8_ = mnorm2->m_data[0];
    auVar79._8_8_ = mnorm2->m_data[2];
    auVar79._0_8_ = mnorm2->m_data[2];
    auVar53._0_8_ =
         dVar69 * (pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[4];
    auVar53._8_8_ =
         dVar69 * (pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[5];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
    auVar40._8_8_ = 0;
    auVar40._0_8_ =
         dVar69 * (pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[3];
    auVar81 = vfmadd231sd_fma(auVar40,auVar64,auVar3);
    auVar28 = vfmadd231pd_fma(auVar53,auVar64,
                              *(undefined1 (*) [16])
                               ((pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                                super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 1));
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                   super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[6];
    auVar81 = vfmadd231sd_fma(auVar81,auVar79,auVar4);
    auVar28 = vfmadd231pd_fma(auVar28,auVar79,
                              *(undefined1 (*) [16])
                               ((pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                                super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array + 7));
    dVar69 = auVar81._0_8_;
    if ((dVar69 != 0.0) || (NAN(dVar69))) {
LAB_005a514a:
      dVar44 = auVar28._0_8_;
      auVar28 = vshufpd_avx(auVar28,auVar28,1);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = dVar44 * dVar44;
      auVar81 = vfmadd231sd_fma(auVar34,auVar81,auVar81);
      auVar81 = vfmadd231sd_fma(auVar81,auVar28,auVar28);
      auVar81 = vsqrtsd_avx(auVar81,auVar81);
      dVar70 = 1.0 / auVar81._0_8_;
      bVar15 = 2.2250738585072014e-308 <= auVar81._0_8_;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = (ulong)bVar15 * (long)(auVar28._0_8_ * dVar70);
      local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
           (double)((ulong)bVar15 * (long)(dVar44 * dVar70));
      auVar30._0_8_ = (ulong)bVar15 * (long)(dVar69 * dVar70) + (ulong)!bVar15 * 0x3ff0000000000000;
      auVar30._8_8_ = 0;
    }
    else {
      uVar8 = vcmppd_avx512vl(auVar28,ZEXT816(0),0);
      if (((uVar8 & 1) == 0) || (auVar29 = ZEXT816(0), (uVar8 & 3) >> 1 == 0)) goto LAB_005a514a;
    }
    auVar17._8_8_ = 0;
    auVar17._0_8_ =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         auVar30._0_8_;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         auVar29._0_8_;
    auVar54._8_8_ = 0;
    auVar54._0_8_ =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] *
         dVar2;
    auVar28 = vfmsub231sd_fma(auVar54,auVar29,auVar104);
    auVar65._8_8_ = 0;
    auVar65._0_8_ =
         dVar1 * local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
    auVar81 = vfmsub231sd_fma(auVar65,auVar17,auVar102);
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         auVar81._0_8_;
    auVar41._8_8_ = 0;
    auVar41._0_8_ =
         dVar68 * local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[3];
    auVar46 = vfmsub231sd_fma(auVar41,auVar30,auVar103);
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         auVar46._0_8_;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         auVar28._0_8_;
    auVar80._8_8_ = 0;
    auVar80._0_8_ =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar28 = vfmadd231sd_fma(auVar80,auVar81,auVar81);
    auVar28 = vfmadd231sd_fma(auVar28,auVar46,auVar46);
    auVar28 = vsqrtsd_avx(auVar28,auVar28);
    dVar68 = auVar28._0_8_;
    if (dVar68 < 0.0001) {
      auVar10._8_8_ = 0x7fffffffffffffff;
      auVar10._0_8_ = 0x7fffffffffffffff;
      auVar28 = vandpd_avx512vl(auVar104,auVar10);
      if (0.9 <= auVar28._0_8_) {
        auVar11._8_8_ = 0x7fffffffffffffff;
        auVar11._0_8_ = 0x7fffffffffffffff;
        auVar28 = vandpd_avx512vl(auVar103,auVar11);
        if (0.9 <= auVar28._0_8_) {
          auVar12._8_8_ = 0x7fffffffffffffff;
          auVar12._0_8_ = 0x7fffffffffffffff;
          auVar28 = vandpd_avx512vl(auVar102,auVar12);
          auVar81 = SUB6416(ZEXT864(0),0) << 0x40;
          if (0.9 <= auVar28._0_8_) goto LAB_005a5263;
          auVar28 = ZEXT816(0x3ff0000000000000);
        }
        else {
          auVar81 = ZEXT816(0x3ff0000000000000);
LAB_005a5263:
          auVar28 = ZEXT816(0);
        }
        auVar46 = ZEXT816(0) << 0x40;
      }
      else {
        auVar46 = ZEXT816(0x3ff0000000000000);
        auVar28 = ZEXT816(0);
        auVar81 = ZEXT816(0) << 0x40;
      }
      auVar55._8_8_ = 0;
      auVar55._0_8_ =
           auVar28._0_8_ *
           -local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
      auVar26 = vfmadd231sd_fma(auVar55,auVar29,auVar46);
      auVar66._8_8_ = 0;
      auVar66._0_8_ =
           auVar81._0_8_ *
           -local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
      auVar28 = vfmadd231sd_fma(auVar66,auVar17,auVar28);
      local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
           auVar28._0_8_;
      auVar42._8_8_ = 0;
      auVar42._0_8_ =
           auVar46._0_8_ *
           -local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
      auVar81 = vfmadd231sd_fma(auVar42,auVar30,auVar81);
      local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
           auVar81._0_8_;
      local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
      super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
           auVar26._0_8_;
      auVar82._8_8_ = 0;
      auVar82._0_8_ =
           local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
           local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
      auVar28 = vfmadd231sd_fma(auVar82,auVar28,auVar28);
      auVar28 = vfmadd231sd_fma(auVar28,auVar81,auVar81);
      auVar28 = vsqrtsd_avx(auVar28,auVar28);
      dVar68 = auVar28._0_8_;
    }
    dVar68 = 1.0 / dVar68;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] *
         dVar68;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
         dVar68;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
         dVar68;
    auVar56._8_8_ = 0;
    auVar56._0_8_ =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar83._8_8_ = 0;
    auVar83._0_8_ =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar28 = vfmsub231sd_fma(auVar83,auVar56,auVar29);
    auVar43._8_8_ = 0;
    auVar43._0_8_ =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    auVar92._8_8_ = 0;
    auVar92._0_8_ =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] *
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar81 = vfmsub231sd_fma(auVar92,auVar43,auVar30);
    auVar67._8_8_ = 0;
    auVar67._0_8_ =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar98._8_8_ = 0;
    auVar98._0_8_ =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] *
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar46 = vfmsub231sd_fma(auVar98,auVar67,auVar17);
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         auVar28._0_8_;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
         auVar81._0_8_;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
         auVar46._0_8_;
    ChFrame<double>::SetRot(&local_140,&local_188);
    pCVar7 = (this->super_ChLinkMate).super_ChLink.Body2;
    ChTransform<double>::TransformParentToLocal
              (mpt2,&(pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos,
               &(pCVar7->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix);
    local_140.coord.pos.m_data[0] = local_1a8;
    local_140.coord.pos.m_data[1] = dStack_1a0;
    local_140.coord.pos.m_data[2] = local_198;
    goto LAB_005a5346;
  }
  auVar20 = ZEXT816(0);
  dVar68 = mnorm1->m_data[0];
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar68;
  dVar1 = mnorm1->m_data[1];
  dVar2 = mnorm1->m_data[2];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar2;
  if (((((dVar68 != 0.0) || (NAN(dVar68))) || (dVar1 != 0.0)) || ((NAN(dVar1) || (dVar2 != 0.0))))
     || (NAN(dVar2))) {
    auVar31._8_8_ = 0;
    auVar31._0_8_ = dVar1 * dVar1;
    auVar28 = vfmadd231sd_fma(auVar31,auVar45,auVar45);
    auVar28 = vfmadd231sd_fma(auVar28,auVar35,auVar35);
    auVar28 = vsqrtsd_avx(auVar28,auVar28);
    bVar15 = 2.2250738585072014e-308 <= auVar28._0_8_;
    dVar69 = 1.0 / auVar28._0_8_;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
         (double)((ulong)bVar15 * (long)(dVar2 * dVar69));
    auVar20._8_8_ = 0;
    auVar20._0_8_ = (ulong)bVar15 * (long)(dVar1 * dVar69);
    auVar21._0_8_ = (ulong)bVar15 * (long)(dVar68 * dVar69) + (ulong)!bVar15 * 0x3ff0000000000000;
    auVar21._8_8_ = 0;
  }
  else {
    auVar21 = ZEXT816(0x3ff0000000000000);
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
  }
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar81 = vfmsub213sd_fma(ZEXT816(0) << 0x40,auVar20,auVar16);
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar81._0_8_;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar21._0_8_;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       auVar20._0_8_;
  auVar93._8_8_ = 0;
  auVar93._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] * -0.0
  ;
  auVar28 = vfmadd213sd_fma(ZEXT816(0),auVar16,auVar93);
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       auVar28._0_8_;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] +
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] * -0.0
  ;
  auVar99._8_8_ = 0;
  auVar99._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar28 = vfmadd231sd_fma(auVar99,auVar81,auVar81);
  auVar84._8_8_ = 0;
  auVar84._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar28 = vfmadd231sd_fma(auVar28,auVar84,auVar84);
  auVar28 = vsqrtsd_avx(auVar28,auVar28);
  dVar68 = auVar28._0_8_;
  if (dVar68 < 0.0001) {
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] +
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] *
         -0.0;
    auVar47._8_8_ = 0;
    auVar47._0_8_ =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] *
         -0.0;
    auVar28 = vfmadd231sd_fma(auVar47,auVar20,ZEXT816(0) << 0x40);
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         auVar28._0_8_;
    auVar81 = vfmsub213sd_fma(ZEXT816(0) << 0x40,auVar21,auVar20);
    auVar85._8_8_ = 0;
    auVar85._0_8_ =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar28 = vfmadd231sd_fma(auVar85,auVar28,auVar28);
    auVar28 = vfmadd231sd_fma(auVar28,auVar81,auVar81);
    auVar28 = vsqrtsd_avx(auVar28,auVar28);
    dVar68 = auVar28._0_8_;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         auVar81._0_8_;
  }
  dVar68 = 1.0 / dVar68;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] *
       dVar68;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       dVar68;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
       dVar68;
  auVar58._8_8_ = 0;
  auVar58._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar86._8_8_ = 0;
  auVar86._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar28 = vfmsub231sd_fma(auVar86,auVar58,auVar16);
  auVar72._8_8_ = 0;
  auVar72._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar94._8_8_ = 0;
  auVar94._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] *
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar81 = vfmsub231sd_fma(auVar94,auVar72,auVar21);
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar100._8_8_ = 0;
  auVar100._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] *
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar46 = vfmsub231sd_fma(auVar100,auVar48,auVar20);
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       auVar28._0_8_;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar81._0_8_;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       auVar46._0_8_;
  ChFrame<double>::SetRot(&local_b8,&local_188);
  if (&local_b8.coord != (ChCoordsys<double> *)mpt1) {
    local_b8.coord.pos.m_data[0] = mpt1->m_data[0];
    local_b8.coord.pos.m_data[1] = mpt1->m_data[1];
    local_b8.coord.pos.m_data[2] = mpt1->m_data[2];
  }
  auVar24 = ZEXT816(0x3ff0000000000000);
  auVar23 = ZEXT816(0) << 0x40;
  dVar68 = mnorm2->m_data[0];
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar68;
  dVar1 = mnorm2->m_data[1];
  dVar2 = mnorm2->m_data[2];
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar2;
  if ((dVar68 != 0.0) || (NAN(dVar68))) {
LAB_005a4d68:
    auVar32._8_8_ = 0;
    auVar32._0_8_ = dVar1 * dVar1;
    auVar28 = vfmadd231sd_fma(auVar32,auVar37,auVar37);
    auVar28 = vfmadd231sd_fma(auVar28,auVar59,auVar59);
    auVar28 = vsqrtsd_avx(auVar28,auVar28);
    dVar69 = 1.0 / auVar28._0_8_;
    bVar15 = 2.2250738585072014e-308 <= auVar28._0_8_;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = (ulong)bVar15 * (long)(dVar2 * dVar69);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = (ulong)bVar15 * (long)(dVar1 * dVar69);
    auVar24._0_8_ = (ulong)bVar15 * (long)(dVar68 * dVar69) + (ulong)!bVar15 * 0x3ff0000000000000;
    auVar24._8_8_ = 0;
  }
  else {
    auVar22 = ZEXT816(0) << 0x40;
    if (dVar1 != 0.0) goto LAB_005a4d68;
    if ((dVar2 != 0.0) || (NAN(dVar2))) goto LAB_005a4d68;
  }
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar24._0_8_;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       auVar23._0_8_;
  auVar81 = vfmsub213sd_fma(ZEXT816(0) << 0x40,auVar23,auVar22);
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar81._0_8_;
  auVar87._8_8_ = 0;
  auVar87._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] * -0.0
  ;
  auVar28 = vfmadd213sd_fma(ZEXT816(0),auVar22,auVar87);
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       auVar28._0_8_;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] +
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] * -0.0
  ;
  auVar95._8_8_ = 0;
  auVar95._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar28 = vfmadd231sd_fma(auVar95,auVar81,auVar81);
  auVar73._8_8_ = 0;
  auVar73._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar28 = vfmadd231sd_fma(auVar28,auVar73,auVar73);
  auVar28 = vsqrtsd_avx(auVar28,auVar28);
  dVar68 = auVar28._0_8_;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       auVar22._0_8_;
  if (dVar68 < 0.0001) {
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] +
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] *
         -0.0;
    auVar38._8_8_ = 0;
    auVar38._0_8_ =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] *
         -0.0;
    auVar28 = vfmadd231sd_fma(auVar38,auVar23,ZEXT816(0));
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         auVar28._0_8_;
    auVar81 = vfmsub213sd_fma(ZEXT816(0),auVar24,auVar23);
    auVar74._8_8_ = 0;
    auVar74._0_8_ =
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
         local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar28 = vfmadd231sd_fma(auVar74,auVar28,auVar28);
    auVar28 = vfmadd231sd_fma(auVar28,auVar81,auVar81);
    auVar28 = vsqrtsd_avx(auVar28,auVar28);
    dVar68 = auVar28._0_8_;
    local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
         auVar81._0_8_;
  }
  dVar68 = 1.0 / dVar68;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] *
       dVar68;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       dVar68;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] *
       dVar68;
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar75._8_8_ = 0;
  auVar75._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar28 = vfmsub231sd_fma(auVar75,auVar49,auVar22);
  auVar60._8_8_ = 0;
  auVar60._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar88._8_8_ = 0;
  auVar88._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] *
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar81 = vfmsub231sd_fma(auVar88,auVar60,auVar24);
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar96._8_8_ = 0;
  auVar96._0_8_ =
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] *
       local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar46 = vfmsub231sd_fma(auVar96,auVar39,auVar23);
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       auVar28._0_8_;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar81._0_8_;
  local_188.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       auVar46._0_8_;
  ChFrame<double>::SetRot(&local_140,&local_188);
  if (&local_140.coord != (ChCoordsys<double> *)mpt2) {
    local_140.coord.pos.m_data[0] = mpt2->m_data[0];
    local_140.coord.pos.m_data[1] = mpt2->m_data[1];
    local_140.coord.pos.m_data[2] = mpt2->m_data[2];
  }
LAB_005a5346:
  ChFrame<double>::operator=(&this->frame1,&local_b8);
  ChFrame<double>::operator=(&this->frame2,&local_140);
  return;
}

Assistant:

void ChLinkMateGeneric::Initialize(std::shared_ptr<ChBodyFrame> mbody1,
                                   std::shared_ptr<ChBodyFrame> mbody2,
                                   bool pos_are_relative,
                                   ChVector<> mpt1,
                                   ChVector<> mpt2,
                                   ChVector<> mnorm1,
                                   ChVector<> mnorm2) {
    assert(mbody1.get() != mbody2.get());

    this->Body1 = mbody1.get();
    this->Body2 = mbody2.get();
    // this->SetSystem(mbody1->GetSystem());

    this->mask.SetTwoBodiesVariables(&Body1->Variables(), &Body2->Variables());

    ChVector<> mx, my, mz, mN;
    ChMatrix33<> mrot;

    ChFrame<> mfr1;
    ChFrame<> mfr2;

    if (pos_are_relative) {
        mN = mnorm1;
        mN.DirToDxDyDz(mx, my, mz);
        mrot.Set_A_axis(mx, my, mz);
        mfr1.SetRot(mrot);
        mfr1.SetPos(mpt1);

        mN = mnorm2;
        mN.DirToDxDyDz(mx, my, mz);
        mrot.Set_A_axis(mx, my, mz);
        mfr2.SetRot(mrot);
        mfr2.SetPos(mpt2);
    } else {
        ChVector<> temp = VECT_Z;
        // from abs to body-rel
        mN = this->Body1->TransformDirectionParentToLocal(mnorm1);
        mN.DirToDxDyDz(mx, my, mz, temp);
        mrot.Set_A_axis(mx, my, mz);
        mfr1.SetRot(mrot);
        mfr1.SetPos(this->Body1->TransformPointParentToLocal(mpt1));

        mN = this->Body2->TransformDirectionParentToLocal(mnorm2);
        mN.DirToDxDyDz(mx, my, mz, temp);
        mrot.Set_A_axis(mx, my, mz);
        mfr2.SetRot(mrot);
        mfr2.SetPos(this->Body2->TransformPointParentToLocal(mpt2));
    }

    this->frame1 = mfr1;
    this->frame2 = mfr2;
}